

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

void __thiscall
amrex::FillPatchIterator::FillPatchIterator
          (FillPatchIterator *this,AmrLevel *amrlevel,MultiFab *leveldata,int boxGrow,Real time,
          int idx,int scomp,int ncomp)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  FabArrayBase *in_XMM0_Qa;
  undefined4 in_stack_00000008;
  int in_stack_0000068c;
  int in_stack_00000690;
  int in_stack_00000694;
  Real in_stack_00000698;
  int in_stack_000006a4;
  FillPatchIterator *in_stack_000006a8;
  undefined4 in_stack_ffffffffffffffe0;
  
  MFIter::MFIter((MFIter *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_XMM0_Qa,
                 (uchar)((uint)in_R8D >> 0x18));
  *(undefined8 *)(in_RDI + 0x60) = in_RSI;
  *(undefined8 *)(in_RDI + 0x68) = in_RDX;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x10faff5);
  MultiFab::MultiFab((MultiFab *)(in_RDI + 0x88));
  *(undefined4 *)(in_RDI + 0x208) = in_stack_00000008;
  MFIter::depth = 0;
  Initialize(in_stack_000006a8,in_stack_000006a4,in_stack_00000698,in_stack_00000694,
             in_stack_00000690,in_stack_0000068c);
  return;
}

Assistant:

FillPatchIterator::FillPatchIterator (AmrLevel& amrlevel,
                                      MultiFab& leveldata,
                                      int       boxGrow,
                                      Real      time,
                                      int       idx,
                                      int       scomp,
                                      int       ncomp)
    :
    MFIter(leveldata),
    m_amrlevel(amrlevel),
    m_leveldata(leveldata),
    m_ncomp(ncomp)
{
    BL_ASSERT(scomp >= 0);
    BL_ASSERT(ncomp >= 1);
    BL_ASSERT(AmrLevel::desc_lst[idx].inRange(scomp,ncomp));
    BL_ASSERT(0 <= idx && idx < AmrLevel::desc_lst.size());

    MFIter::depth = 0;
    Initialize(boxGrow,time,idx,scomp,ncomp);

#ifdef BL_USE_TEAM
    ParallelDescriptor::MyTeam().MemoryBarrier();
#endif
}